

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.c
# Opt level: O3

int64_t time_util_hhmmss_ss_to_utime(double time)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  
  dVar3 = fmod(time,100.0);
  uVar1 = (int)time / 10000;
  uVar2 = (short)((short)(int)time + (short)uVar1 * -10000) * 0x147b;
  return ((ulong)((uVar1 & 0xff) * 360000) + (long)(dVar3 * 100.0 + 0.0) +
         (ulong)((uVar2 >> 0x13) - ((int)uVar2 >> 0x1f) & 0xff) * 6000) * 10000;
}

Assistant:

int64_t time_util_hhmmss_ss_to_utime(double time)
{
    int64_t utime = 0;

    int itime = ((int) time);

    double seconds = fmod(time, 100.0);
    uint8_t minutes = (itime % 10000) / 100;
    uint8_t hours =  itime / 10000;

    utime += seconds *   100;
    utime += minutes *  6000;
    utime += hours   *360000;

    utime *= 10000;

    return utime;
}